

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_char_const,_1l>>
          (database_writer_policy *this,span<const_unsigned_char,__1L> sp)

{
  transaction_base *this_00;
  type num;
  element_type *__result;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_a0;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_90;
  tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&> local_80 [32];
  index_type local_60;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_58;
  typed_address<unsigned_char> local_40;
  typed_address<unsigned_char> addr;
  shared_ptr<unsigned_char> ptr;
  database_writer_policy *this_local;
  span<const_unsigned_char,__1L> sp_local;
  
  sp_local.storage_.super_extent_type<_1L>.size_ = (index_type)sp.storage_.data_;
  this_local = (database_writer_policy *)sp.storage_.super_extent_type<_1L>.size_;
  std::shared_ptr<unsigned_char>::shared_ptr((shared_ptr<unsigned_char> *)&addr);
  local_40 = typed_address<unsigned_char>::null();
  this_00 = this->transaction_;
  local_60 = gsl::span<const_unsigned_char,_-1L>::size
                       ((span<const_unsigned_char,__1L> *)&this_local);
  num = unsigned_cast<long>(&local_60);
  transaction_base::alloc_rw<unsigned_char,void>(&local_58,this_00,num);
  std::tie<std::shared_ptr<unsigned_char>,pstore::typed_address<unsigned_char>>
            ((shared_ptr<unsigned_char> *)local_80,&addr);
  std::tuple<std::shared_ptr<unsigned_char>&,pstore::typed_address<unsigned_char>&>::operator=
            (local_80,&local_58);
  std::pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_>::~pair(&local_58)
  ;
  std::begin<pstore::gsl::span<unsigned_char_const,_1l>>
            ((span<const_unsigned_char,__1L> *)&local_90);
  std::end<pstore::gsl::span<unsigned_char_const,_1l>>((span<const_unsigned_char,__1L> *)&local_a0);
  __result = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&addr);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,unsigned_char*>
            (&local_90,&local_a0,__result);
  sp_local.storage_.data_ = (pointer)typed_address<unsigned_char>::to_address(&local_40);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&addr);
  return (result_type)(value_type)sp_local.storage_.data_;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }